

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::iterator::updateParentBounds
          (iterator *this,uint32_t level,interval<unsigned_long> *key)

{
  pointer pEVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  if (level != 0) {
    pEVar1 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    lVar4 = (ulong)level << 4;
    do {
      lVar2 = *(long *)((long)&pEVar1[-1].node + lVar4);
      lVar5 = (ulong)*(uint *)((long)pEVar1 + lVar4 + -4) * 0x10;
      uVar6 = *(ulong *)(lVar2 + 0x40 + lVar5);
      uVar3 = *(ulong *)(lVar2 + 0x48 + lVar5);
      if (key->left < uVar6) {
        uVar6 = key->left;
      }
      *(ulong *)(lVar2 + 0x40 + lVar5) = uVar6;
      uVar6 = key->right;
      if (key->right < uVar3) {
        uVar6 = uVar3;
      }
      *(ulong *)(lVar2 + 0x48 + lVar5) = uVar6;
      lVar4 = lVar4 + -0x10;
    } while (lVar4 != 0);
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::updateParentBounds(
    uint32_t level, const IntervalMapDetails::interval<TKey>& key) {
    auto& path = this->path;
    while (level) {
        --level;
        auto offset = path.offset(level);
        auto& existing = level == 0 ? path.template node<RootBranch>(level).keyAt(offset)
                                    : path.template node<Branch>(level).keyAt(offset);
        existing.unionWith(key);
    }
}